

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  int iVar1;
  xmlOutputBufferPtr out;
  long lVar2;
  long lVar3;
  int iVar4;
  xmlChar *pxVar5;
  int *piVar6;
  bool bVar7;
  int local_dc;
  int local_cc;
  int local_bc;
  int local_a4;
  int isOneText_1;
  xmlNodePtr child_1;
  char *pszEndCData;
  char *pszBeginCData;
  int isOneText;
  xmlNodePtr child;
  xmlOutputBufferPtr buf;
  xmlChar *end;
  xmlChar *start;
  xmlAttrPtr attr;
  xmlNodePtr unformattedNode;
  xmlNodePtr root;
  xmlNodePtr tmp;
  xmlDocPtr pxStack_18;
  int format;
  xmlNodePtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  iVar1 = ctxt->format;
  attr = (xmlAttrPtr)0x0;
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  out = ctxt->buf;
  pxStack_18 = (xmlDocPtr)cur;
LAB_00206307:
  switch(pxStack_18->type) {
  case XML_ELEMENT_NODE:
    if (((pxStack_18 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar6 = __xmlIndentTreeOutput(), *piVar6 != 0)) {
      if (ctxt->indent_nr < ctxt->level) {
        local_a4 = ctxt->indent_nr;
      }
      else {
        local_a4 = ctxt->level;
      }
      xmlOutputBufferWrite(out,ctxt->indent_size * local_a4,ctxt->indent);
    }
    if ((ctxt->options & 0x100U) == 0) {
      xmlOutputBufferWrite(out,1,"<");
    }
    else {
      smlWriteSemiColonIfNeeded(out);
    }
    lVar2._0_4_ = pxStack_18->compression;
    lVar2._4_4_ = pxStack_18->standalone;
    if ((lVar2 != 0) && (*(long *)(*(long *)&pxStack_18->compression + 0x18) != 0)) {
      xmlOutputBufferWriteString(out,*(char **)(*(long *)&pxStack_18->compression + 0x18));
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,pxStack_18->name);
    if (pxStack_18->oldNs != (_xmlNs *)0x0) {
      xmlNsListDumpOutputCtxt(ctxt,pxStack_18->oldNs);
    }
    for (start = (xmlChar *)pxStack_18->extSubset; start != (xmlChar *)0x0;
        start = *(xmlChar **)(start + 0x30)) {
      xmlAttrDumpOutput(ctxt,(xmlAttrPtr)start);
    }
    if (pxStack_18->children != (_xmlNode *)0x0) {
      if (ctxt->format == 1) {
        for (root = pxStack_18->children; root != (xmlNodePtr)0x0; root = root->next) {
          if (((root->type == XML_TEXT_NODE) || (root->type == XML_CDATA_SECTION_NODE)) ||
             (root->type == XML_ENTITY_REF_NODE)) {
            ctxt->format = 0;
            attr = (xmlAttrPtr)pxStack_18;
            break;
          }
        }
      }
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,1);
      }
      if ((ctxt->options & 0x100U) == 0) {
        xmlOutputBufferWrite(out,1,">");
      }
      else {
        xmlOutputBufferWrite(out,1," ");
        ctxt->quoted = 0;
      }
      if ((ctxt->options & 0x100U) != 0) {
        bVar7 = false;
        if (pxStack_18->children->type == XML_TEXT_NODE) {
          bVar7 = pxStack_18->children->next == (_xmlNode *)0x0;
        }
        if (!bVar7) {
          xmlOutputBufferWrite(out,1,"{");
        }
      }
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(out,1,"\n");
      }
      if (-1 < ctxt->level) {
        ctxt->level = ctxt->level + 1;
      }
      pxStack_18 = (xmlDocPtr)pxStack_18->children;
      goto LAB_00206307;
    }
    if ((ctxt->options & 4U) == 0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      if ((ctxt->options & 0x100U) == 0) {
        xmlOutputBufferWrite(out,2,"/>");
      }
    }
    else {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,1);
      }
      if ((ctxt->options & 0x100U) == 0) {
        xmlOutputBufferWrite(out,3,"></");
        lVar3._0_4_ = pxStack_18->compression;
        lVar3._4_4_ = pxStack_18->standalone;
        if ((lVar3 != 0) && (*(long *)(*(long *)&pxStack_18->compression + 0x18) != 0)) {
          xmlOutputBufferWriteString(out,*(char **)(*(long *)&pxStack_18->compression + 0x18));
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,pxStack_18->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(out,1,">");
      }
      else {
        xmlOutputBufferWrite(out,1," {}");
        ctxt->quoted = 0;
      }
    }
    break;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)pxStack_18);
    break;
  case XML_TEXT_NODE:
    if ((ctxt->options & 0x100U) == 0) {
      if (pxStack_18->intSubset != (_xmlDtd *)0x0) {
        if ((xmlChar *)pxStack_18->name == "textnoenc") {
          xmlOutputBufferWriteString(out,(char *)pxStack_18->intSubset);
        }
        else {
          xmlOutputBufferWriteEscape(out,(xmlChar *)pxStack_18->intSubset,ctxt->escape);
        }
      }
    }
    else {
      if (pxStack_18->intSubset == (_xmlDtd *)0x0) {
        pxStack_18->intSubset = (_xmlDtd *)0x286339;
      }
      if (((pxStack_18->prev != (_xmlNode *)0x0) &&
          (*(char *)&pxStack_18->intSubset->_private != '\n')) && (ctxt->quoted == 0)) {
        smlWriteSemiColonIfNeeded(out);
      }
      smlTextNodeDumpOutput(ctxt,(xmlNodePtr)pxStack_18);
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if ((ctxt->options & 0x100U) == 0) {
      pszEndCData = "<![CDATA[";
    }
    else {
      pszEndCData = "<[[";
      smlWriteSemiColonIfNeeded(out);
    }
    if ((pxStack_18->intSubset == (_xmlDtd *)0x0) ||
       (*(char *)&pxStack_18->intSubset->_private == '\0')) {
      xmlOutputBufferWriteString(out,pszEndCData);
      xmlOutputBufferWriteString(out,"]]>");
    }
    else {
      buf = (xmlOutputBufferPtr)pxStack_18->intSubset;
      end = (xmlChar *)buf;
      for (; *(char *)&buf->context != '\0'; buf = (xmlOutputBufferPtr)((long)&buf->context + 1)) {
        if (((*(char *)&buf->context == ']') && (*(char *)((long)&buf->context + 1) == ']')) &&
           (*(char *)((long)&buf->context + 2) == '>')) {
          buf = (xmlOutputBufferPtr)((long)&buf->context + 2);
          xmlOutputBufferWriteString(out,pszEndCData);
          xmlOutputBufferWrite(out,(int)buf - (int)end,(char *)end);
          xmlOutputBufferWriteString(out,"]]>");
          end = (xmlChar *)buf;
        }
      }
      if ((xmlOutputBufferPtr)end != buf) {
        xmlOutputBufferWriteString(out,pszEndCData);
        xmlOutputBufferWriteString(out,(char *)end);
        xmlOutputBufferWriteString(out,"]]>");
      }
    }
    break;
  case XML_ENTITY_REF_NODE:
    if (((ctxt->options & 0x100U) != 0) && (ctxt->quoted == 0)) {
      xmlOutputBufferWrite(out,1,"\"");
      ctxt->quoted = 1;
    }
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,pxStack_18->name);
    xmlOutputBufferWrite(out,1,";");
    if (((ctxt->options & 0x100U) != 0) &&
       ((pxStack_18->next == (_xmlNode *)0x0 ||
        ((pxStack_18->next->type != XML_ENTITY_REF_NODE &&
         ((pxStack_18->next->type != XML_TEXT_NODE ||
          (iVar4 = xmlStrIsAllBlank(pxStack_18->next->content), iVar4 != 0)))))))) {
      xmlOutputBufferWrite(out,1,"\"");
      ctxt->quoted = 0;
    }
    break;
  default:
    break;
  case XML_PI_NODE:
    if (((pxStack_18 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar6 = __xmlIndentTreeOutput(), *piVar6 != 0)) {
      if (ctxt->indent_nr < ctxt->level) {
        local_bc = ctxt->indent_nr;
      }
      else {
        local_bc = ctxt->level;
      }
      xmlOutputBufferWrite(out,ctxt->indent_size * local_bc,ctxt->indent);
    }
    if (pxStack_18->intSubset == (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(out,2,"<?");
      xmlOutputBufferWriteString(out,pxStack_18->name);
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      xmlOutputBufferWrite(out,2,"?>");
    }
    else {
      xmlOutputBufferWrite(out,2,"<?");
      xmlOutputBufferWriteString(out,pxStack_18->name);
      if (pxStack_18->intSubset != (_xmlDtd *)0x0) {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        else {
          xmlOutputBufferWrite(out,1," ");
        }
        xmlOutputBufferWriteString(out,(char *)pxStack_18->intSubset);
      }
      xmlOutputBufferWrite(out,2,"?>");
    }
    break;
  case XML_COMMENT_NODE:
    if (((pxStack_18 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar6 = __xmlIndentTreeOutput(), *piVar6 != 0)) {
      if (ctxt->indent_nr < ctxt->level) {
        local_cc = ctxt->indent_nr;
      }
      else {
        local_cc = ctxt->level;
      }
      xmlOutputBufferWrite(out,ctxt->indent_size * local_cc,ctxt->indent);
    }
    if (pxStack_18->intSubset != (_xmlDtd *)0x0) {
      if ((ctxt->options & 0x100U) == 0) {
        xmlOutputBufferWrite(out,4,"<!--");
        xmlOutputBufferWriteString(out,(char *)pxStack_18->intSubset);
        xmlOutputBufferWrite(out,3,"-->");
      }
      else {
        smlWriteSemiColonIfNeeded(out);
        pxVar5 = xmlStrchr((xmlChar *)pxStack_18->intSubset,'\n');
        if ((pxVar5 == (xmlChar *)0x0) &&
           (((ctxt->format != 0 || ((_xmlDoc *)pxStack_18->parent == pxStack_18->doc)) ||
            (((pxStack_18->next != (_xmlNode *)0x0 &&
              ((pxStack_18->next->type == XML_TEXT_NODE &&
               (iVar4 = xmlStrIsAllBlank(pxStack_18->next->content), iVar4 != 0)))) &&
             (*pxStack_18->next->content == '\n')))))) {
          xmlOutputBufferWrite(out,1,"#");
          xmlOutputBufferWriteString(out,(char *)pxStack_18->intSubset);
        }
        else {
          xmlOutputBufferWrite(out,3,"#--");
          xmlOutputBufferWriteString(out,(char *)pxStack_18->intSubset);
          xmlOutputBufferWrite(out,2,"--");
        }
      }
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,pxStack_18);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    if (pxStack_18->children == (_xmlNode *)0x0) break;
    pxStack_18 = (xmlDocPtr)pxStack_18->children;
    goto LAB_00206307;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)pxStack_18);
    break;
  case XML_ELEMENT_DECL:
    if ((ctxt->options & 0x100U) == 0) {
      xmlBufDumpElementDecl(out->buffer,(xmlElementPtr)pxStack_18);
    }
    else {
      smlBufDumpElementDecl(out->buffer,(xmlElementPtr)pxStack_18);
    }
    break;
  case XML_ATTRIBUTE_DECL:
    if ((ctxt->options & 0x100U) == 0) {
      xmlBufDumpAttributeDecl(out->buffer,(xmlAttributePtr)pxStack_18);
    }
    else {
      smlBufDumpAttributeDecl(out->buffer,(xmlAttributePtr)pxStack_18);
    }
    break;
  case XML_ENTITY_DECL:
    if ((ctxt->options & 0x100U) == 0) {
      xmlBufDumpEntityDecl(out->buffer,(xmlEntityPtr)pxStack_18);
    }
    else {
      smlBufDumpEntityDecl(out->buffer,(xmlEntityPtr)pxStack_18);
    }
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutputCtxt(ctxt,(xmlNsPtr)pxStack_18);
  }
  while( true ) {
    if (pxStack_18 == (xmlDocPtr)cur) {
      return;
    }
    if (((ctxt->format == 1) && (pxStack_18->type != XML_XINCLUDE_START)) &&
       (pxStack_18->type != XML_XINCLUDE_END)) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    if (pxStack_18->next != (_xmlNode *)0x0) break;
    if (pxStack_18->parent == (_xmlNode *)0x0) {
      return;
    }
    pxStack_18 = (xmlDocPtr)pxStack_18->parent;
    if (pxStack_18->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar6 = __xmlIndentTreeOutput();
      if ((*piVar6 != 0) && (ctxt->format == 1)) {
        if (ctxt->indent_nr < ctxt->level) {
          local_dc = ctxt->indent_nr;
        }
        else {
          local_dc = ctxt->level;
        }
        xmlOutputBufferWrite(out,ctxt->indent_size * local_dc,ctxt->indent);
      }
      if ((ctxt->options & 0x100U) != 0) {
        bVar7 = false;
        if (pxStack_18->children->type == XML_TEXT_NODE) {
          bVar7 = pxStack_18->children->next == (_xmlNode *)0x0;
        }
        if (!bVar7) {
          xmlOutputBufferWrite(out,1,"}");
        }
      }
      if ((ctxt->options & 0x100U) == 0) {
        xmlOutputBufferWrite(out,2,"</");
        if ((*(xmlNs **)&pxStack_18->compression != (xmlNs *)0x0) &&
           ((*(xmlNs **)&pxStack_18->compression)->prefix != (xmlChar *)0x0)) {
          xmlOutputBufferWriteString(out,(char *)(*(xmlNs **)&pxStack_18->compression)->prefix);
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,pxStack_18->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(out,1,">");
      }
      if (pxStack_18 == (xmlDocPtr)attr) {
        ctxt->format = iVar1;
        attr = (xmlAttrPtr)0x0;
      }
    }
  }
  pxStack_18 = (xmlDocPtr)pxStack_18->next;
  goto LAB_00206307;
}

Assistant:

static void
xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlAttrPtr attr;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf;
    DEBUG_CODE(
    const char *pszValue;
    char *c0;
    char *c1;
    switch (cur->type) {
    case XML_TEXT_NODE:
    	pszValue = dbgStr(cur->content);
    	c0 = c1 = "";
    	break;
    case XML_ENTITY_REF_NODE:
    	pszValue = cur->name;
    	c0 = "&";
    	c1 = ";";
    	break;
    default:
    	pszValue = cur->name;
    	c0 = "<";
    	c1 = ">";
    	break;
    }
    );

    DEBUG_ENTER(("xmlNodeDumpOutputInternal(%p, %p [%s]%s%s%s);\n", ctxt, cur, pszXmlElementType[cur->type], c0, pszValue, c1));

    if (cur == NULL) RETURN();
    buf = ctxt->buf;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
            break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
	    break;

        case XML_ELEMENT_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    } else {					/* SML */
	        smlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    }
            break;

        case XML_ATTRIBUTE_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    } else {					/* SML */
	        smlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    }
            break;

        case XML_ENTITY_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    } else {					/* SML */
	        smlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    }
            break;

        case XML_ELEMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

	    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		xmlOutputBufferWrite(buf, 1, "<");
	    } else {						/* SML */
		smlWriteSemiColonIfNeeded(buf);
	    }
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            for (attr = cur->properties; attr != NULL; attr = attr->next)
                xmlAttrDumpOutput(ctxt, attr);

            if (cur->children == NULL) {
                if ((ctxt->options & XML_SAVE_NO_EMPTY) == 0) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    if (!(ctxt->options & XML_SAVE_AS_SML))	{	/* XML */
			xmlOutputBufferWrite(buf, 2, "/>");
		    } /* Else nothing to do as empty tags are implicit for SML */
                } else {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 1);
		    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
			xmlOutputBufferWrite(buf, 3, "></");
			if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			    xmlOutputBufferWriteString(buf,
				    (const char *)cur->ns->prefix);
			    xmlOutputBufferWrite(buf, 1, ":");
			}
			xmlOutputBufferWriteString(buf, (const char *)cur->name);
			if (ctxt->format == 2)
			    xmlOutputBufferWriteWSNonSig(ctxt, 0);
			xmlOutputBufferWrite(buf, 1, ">");
		    } else {						/* SML */
			xmlOutputBufferWrite(buf, 1, " {}");
			ctxt->quoted = 0;
		    }
                }
            } else {
                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_CDATA_SECTION_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            ctxt->format = 0;
                            unformattedNode = cur;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 1);
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 1, ">");
		} else {						/* SML */
		    xmlOutputBufferWrite(buf, 1, " ");
		    ctxt->quoted = 0;
		}
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "{");
		}
                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		if (cur->content == NULL)
		    break;
		if (cur->name != xmlStringTextNoenc) {
		    xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
		} else {
		    /*
		     * Disable escaping, needed for XSLT
		     */
		    xmlOutputBufferWriteString(buf, (const char *) cur->content);
		}
	    } else {					/* SML */
		if (cur->content == NULL) cur->content = (xmlChar *)"";
		if (cur->prev && (cur->content[0] != '\n') && !ctxt->quoted) {
		    smlWriteSemiColonIfNeeded(buf);
		}
		smlTextNodeDumpOutput(ctxt, cur);
	    }
	    break;

        case XML_PI_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    else
                        xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 4, "<!--");
		    xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    xmlOutputBufferWrite(buf, 3, "-->");
		} else {						/* SML */
		    smlWriteSemiColonIfNeeded(buf);
		    /* If the comment does not fit on a single line */
		    DEBUG_PRINTF(("\\x%02X ... \\x%02X\n", cur->content[0], cur->content[xmlStrlen(cur->content)-1]));
		    if (   xmlStrchr(cur->content, '\n')
			/* Or we're not in formatted mode, and can predict that something will follow on the same line */
			|| (   (!ctxt->format)
			       /* Exception for comments at the top level: xmlDocContentDumpOutput() appends an \n after each top node */
			    && (cur->parent != (struct _xmlNode *)cur->doc)
			    && (/* No other sibling node follows, so that there will be a } on the same line */
				   (!cur->next)
				/* Or if it's followed by anything except blank text beginning with a new line */
				|| (cur->next->type != XML_TEXT_NODE)	/* Not text, so there will be a ; then that next node */
				|| (!xmlStrIsAllBlank(cur->next->content)	/* Non blank text, so the first line will be visible or quoted */
				|| (cur->next->content[0] != '\n'))))	/* Blank text, not quoted, but we must preserve the spaces ahead */
			) {		/* Use the long form */
			xmlOutputBufferWrite(buf, 3, "#--");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
			xmlOutputBufferWrite(buf, 2, "--");
		    } else {	/* Use the short 1-line form */
			xmlOutputBufferWrite(buf, 1, "#");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    }
		}
            }
            break;

        case XML_ENTITY_REF_NODE:
	    DEBUG_PRINTF(("# Dumping entity &%s;\n", cur->name));
	    if ((ctxt->options & XML_SAVE_AS_SML) && !ctxt->quoted) { /* SML */
		xmlOutputBufferWrite(buf, 1, "\"");
		ctxt->quoted = 1;
	    }
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
	    if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
		if (!cur->next ||
		    (   (cur->next->type != XML_ENTITY_REF_NODE)
		     && (   (cur->next->type != XML_TEXT_NODE)
			 || xmlStrIsAllBlank(cur->next->content)))) {
		    xmlOutputBufferWrite(buf, 1, "\"");
		    ctxt->quoted = 0;
		}
	    }
            break;

        case XML_CDATA_SECTION_NODE: {
	    const char *pszBeginCData;
	    const char *pszEndCData = "]]>";
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		pszBeginCData = "<![CDATA[";
	    } else {					/* SML */
		pszBeginCData = "<[[";
		smlWriteSemiColonIfNeeded(buf);
	    }
	    if (cur->content == NULL || *cur->content == '\0') {
		xmlOutputBufferWriteString(buf, pszBeginCData);
		xmlOutputBufferWriteString(buf, pszEndCData);
	    } else {
		start = end = cur->content;
		while (*end != '\0') {
		    if ((*end == ']') && (*(end + 1) == ']') &&
			(*(end + 2) == '>')) {
			end = end + 2;
			xmlOutputBufferWriteString(buf, pszBeginCData);
			xmlOutputBufferWrite(buf, end - start, (const char *)start);
			xmlOutputBufferWriteString(buf, pszEndCData);
			start = end;
		    }
		    end++;
		}
		if (start != end) {
		    xmlOutputBufferWriteString(buf, pszBeginCData);
		    xmlOutputBufferWriteString(buf, (const char *)start);
		    xmlOutputBufferWriteString(buf, pszEndCData);
		}
	    }
            break;
        }
        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
            break;

        case XML_NAMESPACE_DECL:
            xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                RETURN();
            if ((ctxt->format == 1) &&
                (cur->type != XML_XINCLUDE_START) &&
                (cur->type != XML_XINCLUDE_END))
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                RETURN();
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "}");
		}

		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 2, "</");
		    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
			xmlOutputBufferWrite(buf, 1, ":");
		    }
	    
		    xmlOutputBufferWriteString(buf, (const char *)cur->name);
		    if (ctxt->format == 2)
			xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    xmlOutputBufferWrite(buf, 1, ">");
		}

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
    RETURN();
}